

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_header(archive_write *a,archive_entry *entry)

{
  int64_t *piVar1;
  byte *pbVar2;
  char cVar3;
  undefined4 uVar4;
  zip_conflict *zip;
  bool bVar5;
  undefined4 *puVar6;
  size_t sVar7;
  mode_t mVar8;
  wchar_t wVar9;
  int iVar10;
  mode_t mVar11;
  uint uVar12;
  wchar_t wVar13;
  wchar_t wVar14;
  uchar *pp;
  archive_string_conv *paVar15;
  la_int64_t lVar16;
  unsigned_long uVar17;
  archive_entry *paVar18;
  int *piVar19;
  char *pcVar20;
  size_t sVar21;
  size_t sVar22;
  uchar *puVar23;
  time_t tVar24;
  uchar uVar25;
  compression cVar26;
  char *pcVar27;
  uchar *p_1;
  uchar *puVar28;
  uchar *zip64_start;
  long lVar29;
  uchar uVar30;
  size_t sVar31;
  time_t in_stack_fffffffffffffee8;
  int local_10c;
  size_t len;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined4 uStack_ee;
  undefined2 uStack_ea;
  undefined2 local_e8;
  undefined4 uStack_e6;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  size_t local_d8;
  char *local_d0;
  uchar local_extra [144];
  
  zip = (zip_conflict *)a->format_data;
  paVar15 = zip->opt_sconv;
  if (paVar15 == (archive_string_conv *)0x0) {
    if (zip->init_default_conversion == 0) {
      paVar15 = archive_string_default_conversion_for_write(&a->archive);
      zip->sconv_default = paVar15;
      zip->init_default_conversion = 1;
    }
    paVar15 = zip->sconv_default;
  }
  mVar8 = archive_entry_filetype(entry);
  if (((mVar8 != 0x4000) && (mVar8 != 0x8000)) && (mVar8 != 0xa000)) {
    __archive_write_entry_filetype_unsupported(&a->archive,entry,"zip");
    return -0x19;
  }
  if ((zip->flags & 1) != 0) {
    wVar9 = archive_entry_size_is_set(entry);
    if ((wVar9 != L'\0') && (lVar16 = archive_entry_size(entry), 0xffffffff < lVar16)) {
      pcVar27 = "Files > 4GB require Zip64 extensions";
LAB_0073a84a:
      archive_set_error(&a->archive,-1,pcVar27);
      return -0x19;
    }
    if (0xffffffff < zip->written_bytes) {
      pcVar27 = "Archives > 4GB require Zip64 extensions";
      goto LAB_0073a84a;
    }
  }
  if (mVar8 != 0x8000) {
    archive_entry_set_size(entry,0);
  }
  zip->entry_offset = zip->written_bytes;
  zip->entry_uncompressed_limit = 0x7fffffffffffffff;
  zip->entry_flags = 0;
  zip->entry_uses_zip64 = 0;
  zip->entry_compressed_size = 0;
  zip->entry_uncompressed_size = 0;
  zip->entry_compressed_written = 0;
  zip->entry_uncompressed_written = 0;
  uVar17 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = (uint32_t)uVar17;
  zip->entry_encryption = ENCRYPTION_NONE;
  archive_entry_free(zip->entry);
  zip->entry = (archive_entry *)0x0;
  if (zip->cctx_valid != '\0') {
    aes_ctr_release(&zip->cctx);
  }
  if (zip->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&zip->hctx);
  }
  zip->hctx_valid = '\0';
  zip->cctx_valid = '\0';
  zip->tctx_valid = '\0';
  if (((mVar8 == 0x8000) &&
      ((wVar9 = archive_entry_size_is_set(entry), wVar9 == L'\0' ||
       (lVar16 = archive_entry_size(entry), 0 < lVar16)))) &&
     (zip->encryption_type - ENCRYPTION_TRADITIONAL < 3)) {
    *(byte *)&zip->entry_flags = (byte)zip->entry_flags | 1;
    zip->entry_encryption = zip->encryption_type;
  }
  paVar18 = archive_entry_clone(entry);
  zip->entry = paVar18;
  if (paVar18 == (archive_entry *)0x0) {
    pcVar27 = "Can\'t allocate zip header data";
    goto LAB_0073a9d0;
  }
  if (paVar15 == (archive_string_conv *)0x0) {
    local_10c = 0;
  }
  else {
    wVar9 = _archive_entry_pathname_l(entry,(char **)local_extra,&len,paVar15);
    if (wVar9 == L'\0') {
      local_10c = 0;
LAB_0073aa34:
      if (len != 0) {
        archive_entry_set_pathname
                  (zip->entry,
                   (char *)CONCAT44(local_extra._4_4_,
                                    CONCAT13(local_extra[3],
                                             CONCAT12(local_extra[2],local_extra._0_2_))));
      }
      bVar5 = true;
      if (mVar8 == 0xa000) {
        wVar9 = _archive_entry_symlink_l(entry,(char **)local_extra,&len,paVar15);
        if (wVar9 == L'\0') {
          if (len != 0) {
            archive_entry_set_symlink
                      (zip->entry,
                       (char *)CONCAT44(local_extra._4_4_,
                                        CONCAT13(local_extra[3],
                                                 CONCAT12(local_extra[2],local_extra._0_2_))));
          }
        }
        else {
          piVar19 = __errno_location();
          if (*piVar19 == 0xc) {
            bVar5 = false;
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory  for Symlink");
          }
        }
      }
    }
    else {
      piVar19 = __errno_location();
      if (*piVar19 != 0xc) {
        pcVar27 = archive_entry_pathname(entry);
        pcVar20 = archive_string_conversion_charset_name(paVar15);
        archive_set_error(&a->archive,0x54,"Can\'t translate Pathname \'%s\' to %s",pcVar27,pcVar20)
        ;
        local_10c = -0x14;
        goto LAB_0073aa34;
      }
      local_10c = 0;
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
      bVar5 = false;
    }
    if (!bVar5) {
      return -0x1e;
    }
  }
  piVar1 = &zip->entry_compressed_size;
  pcVar27 = archive_entry_pathname(zip->entry);
  do {
    cVar3 = *pcVar27;
    pcVar27 = pcVar27 + 1;
  } while ('\0' < cVar3);
  if (cVar3 != '\0') {
    if (zip->opt_sconv == (archive_string_conv *)0x0) {
      pcVar27 = nl_langinfo(0xe);
    }
    else {
      pcVar27 = archive_string_conversion_charset_name(zip->opt_sconv);
    }
    iVar10 = strcmp(pcVar27,"UTF-8");
    if (iVar10 == 0) {
      pbVar2 = (byte *)((long)&zip->entry_flags + 1);
      *pbVar2 = *pbVar2 | 8;
    }
  }
  paVar18 = zip->entry;
  mVar11 = archive_entry_filetype(paVar18);
  pcVar27 = archive_entry_pathname(paVar18);
  if (pcVar27 == (char *)0x0) {
    sVar21 = 0;
  }
  else {
    sVar21 = strlen(pcVar27);
    if ((mVar11 == 0x4000) && ((*pcVar27 == '\0' || (pcVar27[sVar21 - 1] != '/')))) {
      sVar21 = sVar21 + 1;
    }
  }
  if (mVar8 == 0xa000) {
    pcVar27 = archive_entry_symlink(zip->entry);
    if (pcVar27 == (char *)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = strlen(pcVar27);
    }
    zip->entry_uncompressed_limit = sVar22;
    zip->entry_compressed_size = sVar22;
    zip->entry_uncompressed_size = sVar22;
    uVar17 = (*zip->crc32func)((unsigned_long)zip->entry_crc32,pcVar27,sVar22);
    zip->entry_crc32 = (uint32_t)uVar17;
    zip->entry_compression = COMPRESSION_STORE;
    uVar30 = '\x14';
  }
  else {
    if (mVar8 == 0x8000) {
      wVar9 = archive_entry_size_is_set(zip->entry);
      if (wVar9 == L'\0') {
        uVar12 = zip->entry_flags;
        cVar26 = COMPRESSION_DEFLATE;
        if (zip->requested_compression != COMPRESSION_UNSPECIFIED) {
          cVar26 = zip->requested_compression;
        }
        zip->entry_compression = cVar26;
        zip->entry_flags = uVar12 | 8;
        if ((zip->flags & 1) == 0) {
          zip->entry_uses_zip64 = 1;
          uVar25 = '-';
          uVar30 = '-';
        }
        else {
          uVar25 = '\x14';
          uVar30 = '\n';
          if (cVar26 != COMPRESSION_STORE) {
            uVar30 = '\x14';
          }
        }
        if (((uVar12 & 1) != 0) && (zip->entry_encryption - ENCRYPTION_TRADITIONAL < 3)) {
          uVar30 = uVar25;
        }
      }
      else {
        lVar16 = archive_entry_size(zip->entry);
        zip->entry_uncompressed_limit = lVar16;
        cVar26 = COMPRESSION_DEFLATE;
        if (zip->requested_compression != COMPRESSION_UNSPECIFIED) {
          cVar26 = zip->requested_compression;
        }
        zip->entry_compression = cVar26;
        uVar30 = '\x14';
        if (cVar26 == COMPRESSION_STORE) {
          *piVar1 = lVar16;
          uVar30 = '\n';
        }
        zip->entry_uncompressed_size = lVar16;
        if ((zip->entry_flags & 1U) == 0) {
          lVar29 = 0;
        }
        else {
          uVar12 = zip->entry_encryption - ENCRYPTION_TRADITIONAL;
          if (uVar12 < 3) {
            uVar30 = '\x14';
          }
          lVar29 = 0;
          if (uVar12 < 3) {
            lVar29 = (ulong)uVar12 * 8 + 0xc;
          }
          if (cVar26 == COMPRESSION_STORE) {
            *piVar1 = *piVar1 + lVar29;
          }
        }
        if ((((zip->flags & 2) != 0) || (0xffffffff < lVar29 + lVar16)) ||
           (0xff000000 < lVar16 && cVar26 != COMPRESSION_STORE)) {
          zip->entry_uses_zip64 = 1;
          uVar30 = '-';
        }
        zip->entry_flags = zip->entry_flags | 8;
      }
    }
    else {
      zip->entry_compression = COMPRESSION_STORE;
      zip->entry_uncompressed_limit = 0;
      uVar30 = '\x14';
    }
    sVar22 = 0;
    pcVar27 = (char *)0x0;
  }
  uStack_ee = 0;
  uStack_ea = 0;
  local_e8 = 0;
  uStack_e6 = 0;
  uStack_e2 = 0;
  uStack_e0 = 0;
  uStack_de = 0;
  uStack_dc = 0;
  uStack_da = 0;
  len._0_6_ = (uint6)CONCAT14(uVar30,0x4034b50);
  len = CONCAT26((short)zip->entry_flags,(uint6)len);
  if ((zip->entry_encryption & ~ENCRYPTION_TRADITIONAL) == ENCRYPTION_WINZIP_AES128) {
    uStack_f0 = 99;
    uStack_ef = 0;
  }
  else {
    uStack_f0 = (undefined1)zip->entry_compression;
    uStack_ef = (undefined1)((uint)zip->entry_compression >> 8);
  }
  archive_entry_mtime(zip->entry);
  uStack_ee = dos_time(in_stack_fffffffffffffee8);
  uStack_ea = (undefined2)zip->entry_crc32;
  local_e8 = (undefined2)(zip->entry_crc32 >> 0x10);
  if (zip->entry_uses_zip64 == 0) {
    uStack_e6 = (undefined4)zip->entry_compressed_size;
    uVar4 = (undefined4)zip->entry_uncompressed_size;
    uStack_e2 = (undefined2)uVar4;
    uStack_e0 = (undefined2)((uint)uVar4 >> 0x10);
  }
  else {
    uStack_e6 = 0xffffffff;
    uStack_e2 = 0xffff;
    uStack_e0 = 0xffff;
  }
  uStack_de = (undefined2)sVar21;
  if (zip->entry_encryption == ENCRYPTION_TRADITIONAL) {
    puVar6 = &uStack_ee;
    if ((zip->entry_flags & 8) == 0) {
      puVar6 = (undefined4 *)&local_e8;
    }
    zip->trad_chkdat = *(uchar *)((long)puVar6 + 1);
  }
  puVar23 = cd_alloc(zip,0x2e);
  zip->file_header = puVar23;
  zip->central_directory_entries = zip->central_directory_entries + 1;
  puVar23[0] = '\0';
  puVar23[1] = '\0';
  puVar23[2] = '\0';
  puVar23[3] = '\0';
  puVar23[4] = '\0';
  puVar23[5] = '\0';
  puVar23[6] = '\0';
  puVar23[7] = '\0';
  puVar23[8] = '\0';
  puVar23[9] = '\0';
  puVar23[10] = '\0';
  puVar23[0xb] = '\0';
  puVar23[0xc] = '\0';
  puVar23[0xd] = '\0';
  puVar23[0xe] = '\0';
  puVar23[0xf] = '\0';
  puVar23[0x10] = '\0';
  puVar23[0x11] = '\0';
  puVar23[0x12] = '\0';
  puVar23[0x13] = '\0';
  puVar23[0x14] = '\0';
  puVar23[0x15] = '\0';
  puVar23[0x16] = '\0';
  puVar23[0x17] = '\0';
  puVar23[0x18] = '\0';
  puVar23[0x19] = '\0';
  puVar23[0x1a] = '\0';
  puVar23[0x1b] = '\0';
  puVar23[0x1c] = '\0';
  puVar23[0x1d] = '\0';
  puVar23[0x1e] = '\0';
  puVar23[0x1f] = '\0';
  puVar23[0x1e] = '\0';
  puVar23[0x1f] = '\0';
  puVar23[0x20] = '\0';
  puVar23[0x21] = '\0';
  puVar23[0x22] = '\0';
  puVar23[0x23] = '\0';
  puVar23[0x24] = '\0';
  puVar23[0x25] = '\0';
  puVar23[0x26] = '\0';
  puVar23[0x27] = '\0';
  puVar23[0x28] = '\0';
  puVar23[0x29] = '\0';
  puVar23[0x2a] = '\0';
  puVar23[0x2b] = '\0';
  puVar23[0x2c] = '\0';
  puVar23[0x2d] = '\0';
  builtin_memcpy(zip->file_header,"PK\x01\x02",4);
  puVar23 = zip->file_header;
  puVar23[4] = uVar30;
  puVar23[5] = '\x03';
  puVar23 = zip->file_header;
  puVar23[6] = uVar30;
  puVar23[7] = '\0';
  *(short *)(zip->file_header + 8) = (short)zip->entry_flags;
  puVar23 = zip->file_header;
  if ((zip->entry_encryption & ~ENCRYPTION_TRADITIONAL) == ENCRYPTION_WINZIP_AES128) {
    puVar23[10] = 'c';
    uVar25 = '\0';
  }
  else {
    cVar26 = zip->entry_compression;
    puVar23[10] = (uchar)cVar26;
    uVar25 = (uchar)((uint)cVar26 >> 8);
  }
  puVar23[0xb] = uVar25;
  puVar23 = zip->file_header;
  local_d8 = sVar22;
  local_d0 = pcVar27;
  archive_entry_mtime(zip->entry);
  uVar12 = dos_time(in_stack_fffffffffffffee8);
  *(uint *)(puVar23 + 0xc) = uVar12;
  puVar23 = zip->file_header;
  puVar23[0x1c] = (uchar)sVar21;
  puVar23[0x1d] = (uchar)(sVar21 >> 8);
  puVar23 = zip->file_header;
  mVar8 = archive_entry_mode(zip->entry);
  puVar23[0x26] = '\0';
  puVar23[0x27] = '\0';
  puVar23[0x28] = (uchar)mVar8;
  puVar23[0x29] = (uchar)(mVar8 >> 8);
  puVar23 = cd_alloc(zip,sVar21);
  paVar18 = zip->entry;
  pcVar27 = archive_entry_pathname(paVar18);
  sVar21 = strlen(pcVar27);
  mVar8 = archive_entry_filetype(paVar18);
  memcpy(puVar23,pcVar27,sVar21);
  if ((mVar8 == 0x4000) && (pcVar27[sVar21 - 1] != '/')) {
    puVar23[sVar21] = '/';
  }
  memset(local_extra,0,0x90);
  local_extra[0] = 'U';
  local_extra[1] = 'T';
  wVar9 = archive_entry_mtime_is_set(entry);
  wVar13 = archive_entry_atime_is_set(entry);
  wVar14 = archive_entry_ctime_is_set(entry);
  local_extra[2] =
       (wVar14 != L'\0') * '\x04' + (wVar13 != L'\0') * '\x04' + (wVar9 != L'\0') * '\x04' + '\x01';
  local_extra[3] = '\0';
  wVar9 = archive_entry_mtime_is_set(entry);
  wVar13 = archive_entry_atime_is_set(entry);
  wVar14 = archive_entry_ctime_is_set(entry);
  local_extra[4] = (wVar14 != L'\0') << 2 | (wVar13 != L'\0') * '\x02' | wVar9 != L'\0';
  wVar9 = archive_entry_mtime_is_set(entry);
  if (wVar9 == L'\0') {
    puVar23 = local_extra + 5;
  }
  else {
    tVar24 = archive_entry_mtime(entry);
    puVar23 = local_extra + 9;
    local_extra._5_3_ = (undefined3)tVar24;
    local_extra[8] = (uchar)((ulong)tVar24 >> 0x18);
  }
  wVar9 = archive_entry_atime_is_set(entry);
  if (wVar9 != L'\0') {
    tVar24 = archive_entry_atime(entry);
    *(int *)puVar23 = (int)tVar24;
    puVar23 = puVar23 + 4;
  }
  wVar9 = archive_entry_ctime_is_set(entry);
  if (wVar9 != L'\0') {
    tVar24 = archive_entry_ctime(entry);
    *(int *)puVar23 = (int)tVar24;
    puVar23 = puVar23 + 4;
  }
  puVar23[0] = 'u';
  puVar23[1] = 'x';
  puVar23[2] = '\v';
  puVar23[3] = '\0';
  puVar23[4] = '\x01';
  puVar23[5] = '\x04';
  lVar16 = archive_entry_uid(entry);
  puVar23[6] = (uchar)lVar16;
  puVar23[7] = (uchar)((ulong)lVar16 >> 8);
  puVar23[8] = (uchar)((ulong)lVar16 >> 0x10);
  puVar23[9] = (uchar)((ulong)lVar16 >> 0x18);
  puVar23[10] = '\x04';
  lVar16 = archive_entry_gid(entry);
  *(int *)(puVar23 + 0xb) = (int)lVar16;
  puVar28 = puVar23 + 0xf;
  if (((zip->entry_flags & 1) != 0) &&
     ((zip->entry_encryption & ~ENCRYPTION_TRADITIONAL) == ENCRYPTION_WINZIP_AES128)) {
    puVar28[0] = '\x01';
    puVar28[1] = 0x99;
    puVar28[2] = '\a';
    puVar28[3] = '\0';
    puVar28[4] = '\x01';
    puVar28[5] = '\0';
    puVar28[6] = 'A';
    puVar28[7] = 'E';
    wVar9 = archive_entry_size_is_set(zip->entry);
    uVar12 = 1;
    if ((wVar9 != L'\0') && (lVar16 = archive_entry_size(zip->entry), lVar16 < 0x14)) {
      puVar23[0x13] = '\x02';
      puVar23[0x14] = '\0';
      uVar12 = 2;
    }
    zip->aes_vendor = uVar12;
    puVar23[0x17] = (zip->entry_encryption != ENCRYPTION_WINZIP_AES128) * '\x02' + '\x01';
    *(short *)(puVar23 + 0x18) = (short)zip->entry_compression;
    puVar28 = puVar23 + 0x1a;
  }
  zip->file_header_extra_offset = zip->central_directory_bytes;
  sVar31 = (long)puVar28 - (long)local_extra;
  puVar23 = cd_alloc(zip,sVar31);
  memcpy(puVar23,local_extra,sVar31);
  if (zip->entry_uses_zip64 != 0) {
    puVar28[0] = '\x01';
    puVar28[1] = '\0';
    puVar28[2] = '\x10';
    puVar28[3] = '\0';
    *(int64_t *)(puVar28 + 4) = zip->entry_uncompressed_size;
    *(int64_t *)(puVar28 + 0xc) = zip->entry_compressed_size;
    puVar28[2] = '\x10';
    puVar28[3] = '\0';
    puVar28 = puVar28 + 0x14;
  }
  if ((zip->flags & 4) != 0) {
    puVar28[0] = 'x';
    puVar28[1] = 'l';
    puVar28[2] = '\0';
    puVar28[3] = '\0';
    puVar28[4] = '\a';
    puVar28[5] = uVar30;
    puVar28[6] = '\x03';
    puVar28[7] = '\0';
    puVar28[8] = '\0';
    mVar8 = archive_entry_mode(zip->entry);
    puVar28[9] = '\0';
    puVar28[10] = '\0';
    puVar28[0xb] = (uchar)mVar8;
    puVar28[0xc] = (uchar)(mVar8 >> 8);
    puVar28[2] = '\t';
    puVar28[3] = '\0';
    puVar28 = puVar28 + 0xd;
  }
  sVar31 = (long)puVar28 - (long)local_extra;
  uStack_dc = (undefined2)sVar31;
  iVar10 = __archive_write_output(a,&len,0x1e);
  if (iVar10 != 0) {
    return -0x1e;
  }
  zip->written_bytes = zip->written_bytes + 0x1e;
  paVar18 = zip->entry;
  pcVar27 = archive_entry_pathname(paVar18);
  mVar8 = archive_entry_filetype(paVar18);
  uVar12 = 0xffffffe2;
  if (pcVar27 != (char *)0x0) {
    sVar21 = strlen(pcVar27);
    iVar10 = __archive_write_output(a,pcVar27,sVar21);
    uVar12 = 0xffffffe2;
    if (iVar10 == 0) {
      sVar21 = strlen(pcVar27);
      if ((mVar8 == 0x4000) && (pcVar27[sVar21 - 1] != '/')) {
        iVar10 = __archive_write_output(a,"/",1);
        uVar12 = 0xffffffe2;
        if (iVar10 != 0) goto LAB_0073b212;
        sVar21 = sVar21 + 1;
      }
      uVar12 = (uint)sVar21;
    }
  }
LAB_0073b212:
  if ((int)uVar12 < 1) {
    return -0x1e;
  }
  zip->written_bytes = zip->written_bytes + (ulong)uVar12;
  iVar10 = __archive_write_output(a,local_extra,sVar31);
  sVar7 = local_d8;
  if (iVar10 != 0) {
    return -0x1e;
  }
  zip->written_bytes = zip->written_bytes + sVar31;
  if (local_d0 != (char *)0x0) {
    iVar10 = __archive_write_output(a,local_d0,local_d8);
    if (iVar10 != 0) {
      return -0x1e;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + sVar7;
    zip->entry_uncompressed_written = zip->entry_uncompressed_written + sVar7;
    zip->written_bytes = zip->written_bytes + sVar7;
  }
  if (zip->entry_compression != COMPRESSION_DEFLATE) {
    return local_10c;
  }
  (zip->stream).zalloc = (alloc_func)0x0;
  (zip->stream).zfree = (free_func)0x0;
  (zip->stream).opaque = (voidpf)0x0;
  (zip->stream).next_out = zip->buf;
  iVar10 = zip->deflate_compression_level;
  (zip->stream).avail_out = (uInt)zip->len_buf;
  iVar10 = cm_zlib_deflateInit2_(&zip->stream,iVar10,8,-0xf,8,0,"1.3.1",0x70);
  if (iVar10 == 0) {
    return local_10c;
  }
  pcVar27 = "Can\'t init deflate compressor";
LAB_0073a9d0:
  archive_set_error(&a->archive,0xc,pcVar27);
  return -0x1e;
}

Assistant:

static int
archive_write_zip_header(struct archive_write *a, struct archive_entry *entry)
{
	unsigned char local_header[32];
	unsigned char local_extra[144];
	struct zip *zip = a->format_data;
	unsigned char *e;
	unsigned char *cd_extra;
	size_t filename_length;
	const char *slink = NULL;
	size_t slink_size = 0;
	struct archive_string_conv *sconv = get_sconv(a, zip);
	int ret, ret2 = ARCHIVE_OK;
	mode_t type;
	int version_needed = 10;

	/* Ignore types of entries that we don't support. */
	type = archive_entry_filetype(entry);
	if (type != AE_IFREG && type != AE_IFDIR && type != AE_IFLNK) {
		__archive_write_entry_filetype_unsupported(
		    &a->archive, entry, "zip");
		return ARCHIVE_FAILED;
	};

	/* If we're not using Zip64, reject large files. */
	if (zip->flags & ZIP_FLAG_AVOID_ZIP64) {
		/* Reject entries over 4GB. */
		if (archive_entry_size_is_set(entry)
		    && (archive_entry_size(entry) > ZIP_4GB_MAX)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Files > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
		/* Reject entries if archive is > 4GB. */
		if (zip->written_bytes > ZIP_4GB_MAX) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Archives > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
	}

	/* Only regular files can have size > 0. */
	if (type != AE_IFREG)
		archive_entry_set_size(entry, 0);


	/* Reset information from last entry. */
	zip->entry_offset = zip->written_bytes;
	zip->entry_uncompressed_limit = INT64_MAX;
	zip->entry_compressed_size = 0;
	zip->entry_uncompressed_size = 0;
	zip->entry_compressed_written = 0;
	zip->entry_uncompressed_written = 0;
	zip->entry_flags = 0;
	zip->entry_uses_zip64 = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);
	zip->entry_encryption = 0;
	archive_entry_free(zip->entry);
	zip->entry = NULL;

	if (zip->cctx_valid)
		archive_encrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;

	if (type == AE_IFREG
		    &&(!archive_entry_size_is_set(entry)
			|| archive_entry_size(entry) > 0)) {
		switch (zip->encryption_type) {
		case ENCRYPTION_TRADITIONAL:
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			zip->entry_flags |= ZIP_ENTRY_FLAG_ENCRYPTED;
			zip->entry_encryption = zip->encryption_type;
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}


#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	zip->entry = __la_win_entry_in_posix_pathseparator(entry);
	if (zip->entry == entry)
		zip->entry = archive_entry_clone(entry);
#else
	zip->entry = archive_entry_clone(entry);
#endif
	if (zip->entry == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip header data");
		return (ARCHIVE_FATAL);
	}

	if (sconv != NULL) {
		const char *p;
		size_t len;

		if (archive_entry_pathname_l(entry, &p, &len, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate Pathname '%s' to %s",
			    archive_entry_pathname(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
		if (len > 0)
			archive_entry_set_pathname(zip->entry, p);

		/*
		 * There is no standard for symlink handling; we convert
		 * it using the same character-set translation that we use
		 * for filename.
		 */
		if (type == AE_IFLNK) {
			if (archive_entry_symlink_l(entry, &p, &len, sconv)) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory "
					    " for Symlink");
					return (ARCHIVE_FATAL);
				}
				/* No error if we can't convert. */
			} else if (len > 0)
				archive_entry_set_symlink(zip->entry, p);
		}
	}

	/* If filename isn't ASCII and we can use UTF-8, set the UTF-8 flag. */
	if (!is_all_ascii(archive_entry_pathname(zip->entry))) {
		if (zip->opt_sconv != NULL) {
			if (strcmp(archive_string_conversion_charset_name(
					zip->opt_sconv), "UTF-8") == 0)
				zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#if HAVE_NL_LANGINFO
		} else if (strcmp(nl_langinfo(CODESET), "UTF-8") == 0) {
			zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#endif
		}
	}
	filename_length = path_length(zip->entry);

	/* Determine appropriate compression and size for this entry. */
	if (type == AE_IFLNK) {
		slink = archive_entry_symlink(zip->entry);
		if (slink != NULL)
			slink_size = strlen(slink);
		else
			slink_size = 0;
		zip->entry_uncompressed_limit = slink_size;
		zip->entry_compressed_size = slink_size;
		zip->entry_uncompressed_size = slink_size;
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32,
		    (const unsigned char *)slink, slink_size);
		zip->entry_compression = COMPRESSION_STORE;
		version_needed = 20;
	} else if (type != AE_IFREG) {
		zip->entry_compression = COMPRESSION_STORE;
		zip->entry_uncompressed_limit = 0;
		version_needed = 20;
	} else if (archive_entry_size_is_set(zip->entry)) {
		int64_t size = archive_entry_size(zip->entry);
		int64_t additional_size = 0;

		zip->entry_uncompressed_limit = size;
		zip->entry_compression = zip->requested_compression;
		if (zip->entry_compression == COMPRESSION_UNSPECIFIED) {
			zip->entry_compression = COMPRESSION_DEFAULT;
		}
		if (zip->entry_compression == COMPRESSION_STORE) {
			zip->entry_compressed_size = size;
			zip->entry_uncompressed_size = size;
			version_needed = 10;
		} else {
			zip->entry_uncompressed_size = size;
			version_needed = 20;
		}

		if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
			switch (zip->entry_encryption) {
			case ENCRYPTION_TRADITIONAL:
				additional_size = TRAD_HEADER_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_WINZIP_AES128:
				additional_size = WINZIP_AES128_HEADER_SIZE
				    + AUTH_CODE_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_WINZIP_AES256:
				additional_size = WINZIP_AES256_HEADER_SIZE
				    + AUTH_CODE_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_NONE:
			default:
				break;
			}
			if (zip->entry_compression == COMPRESSION_STORE)
				zip->entry_compressed_size += additional_size;
		}

		/*
		 * Set Zip64 extension in any of the following cases
		 * (this was suggested by discussion on info-zip-dev
		 * mailing list):
		 *  = Zip64 is being forced by user
		 *  = File is over 4GiB uncompressed
		 *    (including encryption header, if any)
		 *  = File is close to 4GiB and is being compressed
		 *    (compression might make file larger)
		 */
		if ((zip->flags & ZIP_FLAG_FORCE_ZIP64)
		    || (zip->entry_uncompressed_size + additional_size > ZIP_4GB_MAX)
		    || (zip->entry_uncompressed_size > ZIP_4GB_MAX_UNCOMPRESSED
			&& zip->entry_compression != COMPRESSION_STORE)) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		}

		/* We may know the size, but never the CRC. */
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
	} else {
		/* We don't know the size. Use the default
		 * compression unless specified otherwise.
		 * We enable Zip64 extensions unless we're told not to.
		 */

		zip->entry_compression = zip->requested_compression;
		if(zip->entry_compression == COMPRESSION_UNSPECIFIED){
			zip->entry_compression = COMPRESSION_DEFAULT;
		}

		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
		if ((zip->flags & ZIP_FLAG_AVOID_ZIP64) == 0) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		} else if (zip->entry_compression == COMPRESSION_STORE) {
			version_needed = 10;
		} else {
			version_needed = 20;
		}

		if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
			switch (zip->entry_encryption) {
			case ENCRYPTION_TRADITIONAL:
			case ENCRYPTION_WINZIP_AES128:
			case ENCRYPTION_WINZIP_AES256:
				if (version_needed < 20)
					version_needed = 20;
				break;
			case ENCRYPTION_NONE:
			default:
				break;
			}
		}
	}

	/* Format the local header. */
	memset(local_header, 0, sizeof(local_header));
	memcpy(local_header, "PK\003\004", 4);
	archive_le16enc(local_header + 4, version_needed);
	archive_le16enc(local_header + 6, zip->entry_flags);
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	    || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)
		archive_le16enc(local_header + 8, WINZIP_AES_ENCRYPTION);
	else
		archive_le16enc(local_header + 8, zip->entry_compression);
	archive_le32enc(local_header + 10,
		dos_time(archive_entry_mtime(zip->entry)));
	archive_le32enc(local_header + 14, zip->entry_crc32);
	if (zip->entry_uses_zip64) {
		/* Zip64 data in the local header "must" include both
		 * compressed and uncompressed sizes AND those fields
		 * are included only if these are 0xffffffff;
		 * THEREFORE these must be set this way, even if we
		 * know one of them is smaller. */
		archive_le32enc(local_header + 18, ZIP_4GB_MAX);
		archive_le32enc(local_header + 22, ZIP_4GB_MAX);
	} else {
		archive_le32enc(local_header + 18, (uint32_t)zip->entry_compressed_size);
		archive_le32enc(local_header + 22, (uint32_t)zip->entry_uncompressed_size);
	}
	archive_le16enc(local_header + 26, (uint16_t)filename_length);

	if (zip->entry_encryption == ENCRYPTION_TRADITIONAL) {
		if (zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END)
			zip->trad_chkdat = local_header[11];
		else
			zip->trad_chkdat = local_header[17];
	}

	/* Format as much of central directory file header as we can: */
	zip->file_header = cd_alloc(zip, 46);
	/* If (zip->file_header == NULL) XXXX */
	++zip->central_directory_entries;
	memset(zip->file_header, 0, 46);
	memcpy(zip->file_header, "PK\001\002", 4);
	/* "Made by PKZip 2.0 on Unix." */
	archive_le16enc(zip->file_header + 4, 3 * 256 + version_needed);
	archive_le16enc(zip->file_header + 6, version_needed);
	archive_le16enc(zip->file_header + 8, zip->entry_flags);
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	    || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)
		archive_le16enc(zip->file_header + 10, WINZIP_AES_ENCRYPTION);
	else
		archive_le16enc(zip->file_header + 10, zip->entry_compression);
	archive_le32enc(zip->file_header + 12,
		dos_time(archive_entry_mtime(zip->entry)));
	archive_le16enc(zip->file_header + 28, (uint16_t)filename_length);
	/* Following Info-Zip, store mode in the "external attributes" field. */
	archive_le32enc(zip->file_header + 38,
	    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
	e = cd_alloc(zip, filename_length);
	/* If (e == NULL) XXXX */
	copy_path(zip->entry, e);

	/* Format extra data. */
	memset(local_extra, 0, sizeof(local_extra));
	e = local_extra;

	/* First, extra blocks that are the same between
	 * the local file header and the central directory.
	 * We format them once and then duplicate them. */

	/* UT timestamp, length depends on what timestamps are set. */
	memcpy(e, "UT", 2);
	archive_le16enc(e + 2,
	    1
	    + (archive_entry_mtime_is_set(entry) ? 4 : 0)
	    + (archive_entry_atime_is_set(entry) ? 4 : 0)
	    + (archive_entry_ctime_is_set(entry) ? 4 : 0));
	e += 4;
	*e++ =
	    (archive_entry_mtime_is_set(entry) ? 1 : 0)
	    | (archive_entry_atime_is_set(entry) ? 2 : 0)
	    | (archive_entry_ctime_is_set(entry) ? 4 : 0);
	if (archive_entry_mtime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_mtime(entry));
		e += 4;
	}
	if (archive_entry_atime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_atime(entry));
		e += 4;
	}
	if (archive_entry_ctime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_ctime(entry));
		e += 4;
	}

	/* ux Unix extra data, length 11, version 1 */
	/* TODO: If uid < 64k, use 2 bytes, ditto for gid. */
	memcpy(e, "ux\013\000\001", 5);
	e += 5;
	*e++ = 4; /* Length of following UID */
	archive_le32enc(e, (uint32_t)archive_entry_uid(entry));
	e += 4;
	*e++ = 4; /* Length of following GID */
	archive_le32enc(e, (uint32_t)archive_entry_gid(entry));
	e += 4;

	/* AES extra data field: WinZIP AES information, ID=0x9901 */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED)
	    && (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	        || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)) {

		memcpy(e, "\001\231\007\000\001\000AE", 8);
		/* AES vendor version AE-2 does not store a CRC.
		 * WinZip 11 uses AE-1, which does store the CRC,
		 * but it does not store the CRC when the file size
		 * is less than 20 bytes. So we simulate what
		 * WinZip 11 does.
		 * NOTE: WinZip 9.0 and 10.0 uses AE-2 by default. */
		if (archive_entry_size_is_set(zip->entry)
		    && archive_entry_size(zip->entry) < 20) {
			archive_le16enc(e+4, AES_VENDOR_AE_2);
			zip->aes_vendor = AES_VENDOR_AE_2;/* no CRC. */
		} else
			zip->aes_vendor = AES_VENDOR_AE_1;
		e += 8;
		/* AES encryption strength. */
		*e++ = (zip->entry_encryption == ENCRYPTION_WINZIP_AES128)?1:3;
		/* Actual compression method. */
		archive_le16enc(e, zip->entry_compression);
		e += 2;
	}

	/* Copy UT ,ux, and AES-extra into central directory as well. */
	zip->file_header_extra_offset = zip->central_directory_bytes;
	cd_extra = cd_alloc(zip, e - local_extra);
	memcpy(cd_extra, local_extra, e - local_extra);

	/*
	 * Following extra blocks vary between local header and
	 * central directory. These are the local header versions.
	 * Central directory versions get formatted in
	 * archive_write_zip_finish_entry() below.
	 */

	/* "[Zip64 entry] in the local header MUST include BOTH
	 * original [uncompressed] and compressed size fields." */
	if (zip->entry_uses_zip64) {
		unsigned char *zip64_start = e;
		memcpy(e, "\001\000\020\000", 4);
		e += 4;
		archive_le64enc(e, zip->entry_uncompressed_size);
		e += 8;
		archive_le64enc(e, zip->entry_compressed_size);
		e += 8;
		archive_le16enc(zip64_start + 2, (uint16_t)(e - (zip64_start + 4)));
	}

	if (zip->flags & ZIP_FLAG_EXPERIMENT_xl) {
		/* Experimental 'xl' extension to improve streaming. */
		unsigned char *external_info = e;
		int included = 7;
		memcpy(e, "xl\000\000", 4); // 0x6c65 + 2-byte length
		e += 4;
		e[0] = included; /* bitmap of included fields */
		e += 1;
		if (included & 1) {
			archive_le16enc(e, /* "Version created by" */
			    3 * 256 + version_needed);
			e += 2;
		}
		if (included & 2) {
			archive_le16enc(e, 0); /* internal file attributes */
			e += 2;
		}
		if (included & 4) {
			archive_le32enc(e,  /* external file attributes */
			    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
			e += 4;
		}
		if (included & 8) {
			// Libarchive does not currently support file comments.
		}
		archive_le16enc(external_info + 2, (uint16_t)(e - (external_info + 4)));
	}

	/* Update local header with size of extra data and write it all out: */
	archive_le16enc(local_header + 28, (uint16_t)(e - local_extra));

	ret = __archive_write_output(a, local_header, 30);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 30;

	ret = write_path(zip->entry, a);
	if (ret <= ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += ret;

	ret = __archive_write_output(a, local_extra, e - local_extra);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += e - local_extra;

	/* For symlinks, write the body now. */
	if (slink != NULL) {
		ret = __archive_write_output(a, slink, slink_size);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->entry_compressed_written += slink_size;
		zip->entry_uncompressed_written += slink_size;
		zip->written_bytes += slink_size;
	}

#ifdef HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		zip->stream.zalloc = Z_NULL;
		zip->stream.zfree = Z_NULL;
		zip->stream.opaque = Z_NULL;
		zip->stream.next_out = zip->buf;
		zip->stream.avail_out = (uInt)zip->len_buf;
		if (deflateInit2(&zip->stream, zip->deflate_compression_level,
		    Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't init deflate compressor");
			return (ARCHIVE_FATAL);
		}
	}
#endif

	return (ret2);
}